

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::onRecoverableException
          (RootExceptionCallback *this,Exception *exception)

{
  int iVar1;
  ExceptionImpl *this_00;
  
  iVar1 = std::uncaught_exceptions();
  if (iVar1 != 0) {
    logException(this,ERROR,exception);
    return;
  }
  this_00 = (ExceptionImpl *)__cxa_allocate_exception(0x1b8);
  ExceptionImpl::ExceptionImpl(this_00,exception);
  __cxa_throw(this_00,&ExceptionImpl::typeinfo,ExceptionImpl::~ExceptionImpl);
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    if (_::uncaughtExceptionCount() > 0) {
      // Bad time to throw an exception.  Just log instead.
      //
      // TODO(someday): We should really compare uncaughtExceptionCount() against the count at
      //   the innermost runCatchingExceptions() frame in this thread to tell if exceptions are
      //   being caught correctly.
      logException(LogSeverity::ERROR, mv(exception));
    } else {
      throw ExceptionImpl(mv(exception));
    }
  }